

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

If_Grp_t * If_CluDecUsingCofs(If_Grp_t *__return_storage_ptr__,word *pTruth,int nVars,int nLutLeaf)

{
  uint p;
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  int *piVar14;
  int Pla2Var [18];
  int Var2Pla [18];
  int P2V [18];
  int V2P [18];
  word pF2 [1024];
  word *local_21a0;
  int aiStack_2178 [20];
  int aiStack_2128 [20];
  int local_20d8 [20];
  int local_2088 [20];
  word local_2038 [1025];
  
  __return_storage_ptr__->nVars = '\0';
  __return_storage_ptr__->nMyu = '\0';
  __return_storage_ptr__->pVars[0] = '\0';
  __return_storage_ptr__->pVars[1] = '\0';
  __return_storage_ptr__->pVars[2] = '\0';
  __return_storage_ptr__->pVars[3] = '\0';
  __return_storage_ptr__->pVars[4] = '\0';
  __return_storage_ptr__->pVars[5] = '\0';
  __return_storage_ptr__->pVars[6] = '\0';
  __return_storage_ptr__->pVars[7] = '\0';
  __return_storage_ptr__->pVars[8] = '\0';
  __return_storage_ptr__->pVars[9] = '\0';
  __return_storage_ptr__->pVars[10] = '\0';
  __return_storage_ptr__->pVars[0xb] = '\0';
  __return_storage_ptr__->pVars[0xc] = '\0';
  __return_storage_ptr__->pVars[0xd] = '\0';
  __return_storage_ptr__->pVars[0xe] = '\0';
  __return_storage_ptr__->pVars[0xf] = '\0';
  uVar8 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if (nVars < 7) {
    uVar8 = 1;
  }
  if (0 < (int)uVar8) {
    memcpy(local_2038,pTruth,uVar8 << 3);
  }
  iVar11 = nVars - nLutLeaf;
  if (0 < nVars) {
    uVar8 = 0;
    do {
      aiStack_2178[uVar8] = (int)uVar8;
      aiStack_2128[uVar8] = (int)uVar8;
      uVar8 = uVar8 + 1;
    } while ((uint)nVars != uVar8);
  }
  if (0 < iVar11) {
    iVar7 = 0;
    local_21a0 = local_2038;
    do {
      p = nVars - 1;
      uVar13 = p;
      if (0 < nVars) {
        piVar14 = aiStack_2178 + p;
        uVar5 = nVars;
        while( true ) {
          uVar13 = uVar5 - 1;
          uVar6 = If_CluDetectSpecialCaseCofs(local_21a0,nVars,uVar13);
          if (uVar6 != 0xffffffff) break;
          piVar14 = piVar14 + -1;
          uVar13 = uVar5 - 1;
          bVar4 = (int)uVar5 < 1;
          uVar5 = uVar13;
          if (uVar13 == 0 || bVar4) {
            return __return_storage_ptr__;
          }
        }
        iVar1 = *piVar14;
        iVar10 = aiStack_2128[iVar1];
        while (iVar10 < (int)p) {
          iVar2 = aiStack_2178[iVar10];
          aiStack_2128[iVar2] = aiStack_2128[iVar2] + 1;
          iVar3 = aiStack_2128[(long)iVar10 + -0x13];
          aiStack_2128[iVar3] = aiStack_2128[iVar3] + -1;
          aiStack_2128[(long)iVar10 + -0x13] = iVar2;
          aiStack_2178[iVar10] = iVar3;
          iVar10 = aiStack_2128[iVar1];
        }
        uVar8 = 0;
        do {
          local_20d8[uVar8] = (int)uVar8;
          local_2088[uVar8] = (int)uVar8;
          uVar8 = uVar8 + 1;
        } while ((uint)nVars != uVar8);
        If_CluMoveVar(local_21a0,nVars,local_2088,local_20d8,uVar13,p);
        if (uVar6 < 2) {
          if (nVars < 7) {
            uVar8 = Truth6[(int)p] & *local_21a0;
            uVar12 = uVar8 >> ((byte)(1 << ((byte)p & 0x1f)) & 0x3f);
LAB_003eedce:
            *local_21a0 = uVar12 | uVar8;
            nVars = p;
          }
          else {
            local_21a0 = local_21a0 + (1 << ((char)nVars - 6U & 0x1f)) / 2;
            nVars = p;
          }
        }
        else {
          bVar4 = nVars < 7;
          nVars = p;
          if (bVar4) {
            uVar8 = ~Truth6[(int)p] & *local_21a0;
            uVar12 = uVar8 << ((byte)(1 << ((byte)p & 0x1f)) & 0x3f);
            goto LAB_003eedce;
          }
        }
      }
      if (uVar13 == 0xffffffff) {
        return __return_storage_ptr__;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar11);
  }
  cVar9 = (char)nLutLeaf;
  __return_storage_ptr__->nVars = cVar9;
  __return_storage_ptr__->nMyu = '\x02';
  if ('\0' < cVar9) {
    uVar8 = 0;
    do {
      __return_storage_ptr__->pVars[uVar8] = (char)aiStack_2178[uVar8];
      uVar8 = uVar8 + 1;
    } while ((uint)(int)cVar9 != uVar8);
  }
  return __return_storage_ptr__;
}

Assistant:

If_Grp_t If_CluDecUsingCofs( word * pTruth, int nVars, int nLutLeaf )
{
    If_Grp_t G = {0};
    word pF2[CLU_WRD_MAX], * pF = pF2;
    int Var2Pla[CLU_VAR_MAX+2], Pla2Var[CLU_VAR_MAX+2];
    int V2P[CLU_VAR_MAX+2], P2V[CLU_VAR_MAX+2];
    int nVarsNeeded = nVars - nLutLeaf;
    int v, i, k, iVar, State;
//Kit_DsdPrintFromTruth( (unsigned*)pTruth, nVars ); printf( "\n" );
    // create local copy
    If_CluCopy( pF, pTruth, nVars );
    for ( k = 0; k < nVars; k++ )
        Var2Pla[k] = Pla2Var[k] = k;
    // find decomposable vars 
    for ( i = 0; i < nVarsNeeded; i++ )
    {
        for ( v = nVars - 1; v >= 0; v-- )
        {
            State = If_CluDetectSpecialCaseCofs( pF, nVars, v );
            if ( State == -1 )
                continue;
            // update the variable place
            iVar = Pla2Var[v];
            while ( Var2Pla[iVar] < nVars - 1 )
            {
                int iPlace0 = Var2Pla[iVar];
                int iPlace1 = Var2Pla[iVar]+1;
                Var2Pla[Pla2Var[iPlace0]]++;
                Var2Pla[Pla2Var[iPlace1]]--;
                Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
                Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
                Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
            }
            // move this variable to the top
            for ( k = 0; k < nVars; k++ )
                V2P[k] = P2V[k] = k;
//Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
            If_CluMoveVar( pF, nVars, V2P, P2V, v, nVars - 1 );
//Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
            // choose cofactor to follow
            iVar = nVars - 1;
            if ( State == 0 || State == 1 ) // need cof1
            {
                if ( iVar < 6 )
                    pF[0] = (pF[0] &  Truth6[iVar]) | ((pF[0] &  Truth6[iVar]) >> (1 << iVar));
                else
                    pF += If_CluWordNum( nVars ) / 2;
            }
            else // need cof0
            {
                if ( iVar < 6 )
                    pF[0] = (pF[0] & ~Truth6[iVar]) | ((pF[0] & ~Truth6[iVar]) << (1 << iVar));
            }
            // update the variable count
            nVars--;
            break;
        }
        if ( v == -1 )
            return G;
    }
    // create the resulting group
    G.nVars = nLutLeaf;
    G.nMyu = 2;
    for ( v = 0; v < G.nVars; v++ )
        G.pVars[v] = Pla2Var[v];
    return G;
}